

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_ghost_flags_off(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *local_38;
  char *s;
  char *flags;
  ghost_level *l;
  ghost *g;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("g",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x846,"enum parser_error parse_ghost_flags_off(struct parser *)");
  }
  for (flags = *(char **)((long)pvVar3 + 0x18); *(long *)flags != 0; flags = *(char **)flags) {
  }
  _Var1 = parser_hasval(p,"flags");
  if (_Var1) {
    pcVar4 = parser_getstr(p,"flags");
    pcVar4 = string_make(pcVar4);
    local_38 = strtok(pcVar4," |");
    while (local_38 != (char *)0x0) {
      eVar2 = grab_flag((bitflag *)(flags + 0x54),0xc,r_info_flags,local_38);
      if (eVar2 != 0) {
        mem_free(pcVar4);
        quit_fmt("bad mf-flag: %s",local_38);
        return PARSE_ERROR_INVALID_FLAG;
      }
      local_38 = strtok((char *)0x0," |");
    }
    mem_free(pcVar4);
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_ghost_flags_off(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	char *flags;
	char *s;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	if (!parser_hasval(p, "flags"))
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(l->flags_off, RF_SIZE, r_info_flags, s)) {
			mem_free(flags);
			quit_fmt("bad mf-flag: %s", s);
			return PARSE_ERROR_INVALID_FLAG;
		}
		s = strtok(NULL, " |");
	}

	mem_free(flags);
	return PARSE_ERROR_NONE;
}